

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclCnRunner.cpp
# Opt level: O2

void __thiscall xmrig::OclCnRunner::OclCnRunner(OclCnRunner *this,size_t index,OclLaunchData *data)

{
  string *psVar1;
  OclVendor OVar2;
  initializer_list<_cl_mem_*> __l;
  initializer_list<xmrig::CnBranchKernel_*> __l_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string local_58;
  vector<_cl_mem_*,_std::allocator<_cl_mem_*>_> *local_38;
  
  OclBaseRunner::OclBaseRunner(&this->super_OclBaseRunner,index,data);
  (this->super_OclBaseRunner).super_IOclRunner._vptr_IOclRunner =
       (_func_int **)&PTR__OclCnRunner_001bc2a0;
  this->m_scratchpads = (cl_mem)0x0;
  this->m_states = (cl_mem)0x0;
  this->m_cnr = (cl_program)0x0;
  this->m_cn0 = (Cn0Kernel *)0x0;
  this->m_cn1 = (Cn1Kernel *)0x0;
  this->m_cn2 = (Cn2Kernel *)0x0;
  this->m_height = 0;
  __l._M_len = 4;
  __l._M_array = (iterator)&DAT_001951b0;
  std::vector<_cl_mem_*,_std::allocator<_cl_mem_*>_>::vector
            (&this->m_branches,__l,(allocator_type *)&bStack_98);
  __l_00._M_len = 4;
  __l_00._M_array = (iterator)&DAT_001951d0;
  local_38 = &this->m_branches;
  std::vector<xmrig::CnBranchKernel_*,_std::allocator<xmrig::CnBranchKernel_*>_>::vector
            (&this->m_branchKernels,__l_00,(allocator_type *)&bStack_98);
  OVar2 = (data->device).m_vendorId;
  std::__cxx11::to_string(&local_58,0x20000);
  std::operator+(&local_78," -DITERATIONS=",&local_58);
  std::operator+(&bStack_98,&local_78,"U");
  psVar1 = &(this->super_OclBaseRunner).m_options;
  std::__cxx11::string::append((string *)psVar1);
  std::__cxx11::string::~string((string *)&bStack_98);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::to_string(&local_58,0xffff0);
  std::operator+(&local_78," -DMASK=",&local_58);
  std::operator+(&bStack_98,&local_78,"U");
  std::__cxx11::string::append((string *)psVar1);
  std::__cxx11::string::~string((string *)&bStack_98);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::to_string(&local_58,(data->thread).m_worksize);
  std::operator+(&local_78," -DWORKSIZE=",&local_58);
  std::operator+(&bStack_98,&local_78,"U");
  std::__cxx11::string::append((string *)psVar1);
  std::__cxx11::string::~string((string *)&bStack_98);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::to_string(&local_58,(uint)(OVar2 != OCL_VENDOR_NVIDIA) * 2);
  std::operator+(&local_78," -DSTRIDED_INDEX=",&local_58);
  std::operator+(&bStack_98,&local_78,"U");
  std::__cxx11::string::append((string *)psVar1);
  std::__cxx11::string::~string((string *)&bStack_98);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::to_string(&local_58,1 << ((byte)(data->thread).m_memChunk & 0x1f));
  std::operator+(&local_78," -DMEM_CHUNK_EXPONENT=",&local_58);
  std::operator+(&bStack_98,&local_78,"U");
  std::__cxx11::string::append((string *)psVar1);
  std::__cxx11::string::~string((string *)&bStack_98);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::to_string(&local_58,0x100000);
  std::operator+(&local_78," -DMEMORY=",&local_58);
  std::operator+(&bStack_98,&local_78,"LU");
  std::__cxx11::string::append((string *)psVar1);
  std::__cxx11::string::~string((string *)&bStack_98);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::to_string(&local_78,(data->thread).m_unrollFactor);
  std::operator+(&bStack_98," -DCN_UNROLL=",&local_78);
  std::__cxx11::string::append((string *)psVar1);
  std::__cxx11::string::~string((string *)&bStack_98);
  std::__cxx11::string::~string((string *)&local_78);
  return;
}

Assistant:

xmrig::OclCnRunner::OclCnRunner(size_t index, const OclLaunchData &data) : OclBaseRunner(index, data)
{
    uint32_t stridedIndex = data.thread.stridedIndex();
    if (data.device.vendorId() == OCL_VENDOR_NVIDIA) {
        stridedIndex = 0;
    }
    else {
        stridedIndex = 2;
    }

    m_options += " -DITERATIONS="           + std::to_string(CnAlgo::CN_ITER >> 1) + "U";
    m_options += " -DMASK="                 + std::to_string(CnAlgo::CN_MASK) + "U";
    m_options += " -DWORKSIZE="             + std::to_string(data.thread.worksize()) + "U";
    m_options += " -DSTRIDED_INDEX="        + std::to_string(stridedIndex) + "U";
    m_options += " -DMEM_CHUNK_EXPONENT="   + std::to_string(1u << data.thread.memChunk()) + "U";
    m_options += " -DMEMORY="               + std::to_string(CnAlgo::CN_MEMORY) + "LU";
    m_options += " -DCN_UNROLL="            + std::to_string(data.thread.unrollFactor());
}